

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxSwitchStatement::Resolve(FxSwitchStatement *this,FCompileContext *ctx)

{
  FxExpression *pFVar1;
  FxExpression *pFVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  FxIntCast *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  FxSequence *this_01;
  undefined4 extraout_var_02;
  FxExpression **ppFVar8;
  FCompileContext *size;
  size_t size_00;
  ulong index;
  undefined1 local_e8 [8];
  CaseAddr ca;
  FxCaseStatement *casestmt_1;
  FxExpression *line_1;
  iterator __end1_1;
  iterator __begin1_1;
  FArgumentList *__range1_1;
  int local_a8;
  int maxcase;
  int mincase;
  int i_1;
  FxSequence *seq;
  FxExpression *local_88;
  FxCaseStatement *casestmt;
  uint local_78;
  uint i;
  int casebreak;
  int caseindex;
  int defaultbreak;
  int defaultindex;
  FArgumentList *content;
  FxExpression **line;
  iterator __end1;
  iterator __begin1;
  FArgumentList *__range1;
  FxExpression *outerctrl;
  FxExpression *x;
  FCompileContext *ctx_local;
  FxSwitchStatement *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    size = ctx;
    if (this->Condition != (FxExpression *)0x0) {
      iVar4 = (*this->Condition->_vptr_FxExpression[2])();
      this->Condition = (FxExpression *)CONCAT44(extraout_var,iVar4);
    }
    if (this->Condition == (FxExpression *)0x0) {
      if (this != (FxSwitchStatement *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxSwitchStatement *)0x0;
    }
    else {
      if (this->Condition->ValueType != (PType *)TypeName) {
        this_00 = (FxIntCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
        FxIntCast::FxIntCast(this_00,this->Condition,false,false);
        this->Condition = (FxExpression *)this_00;
        if (this->Condition != (FxExpression *)0x0) {
          iVar4 = (*this->Condition->_vptr_FxExpression[2])();
          this->Condition = (FxExpression *)CONCAT44(extraout_var_00,iVar4);
        }
        if (this->Condition == (FxExpression *)0x0) {
          if (this != (FxSwitchStatement *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          return (FxExpression *)0x0;
        }
      }
      uVar5 = TArray<FxExpression_*,_FxExpression_*>::Size
                        (&(this->Content).super_TArray<FxExpression_*,_FxExpression_*>);
      if (uVar5 == 0) {
        size_00 = 0;
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,0,"Empty switch statement");
        uVar5 = (*this->Condition->_vptr_FxExpression[3])();
        if ((uVar5 & 1) == 0) {
          this_local = (FxSwitchStatement *)this->Condition;
          this->Condition = (FxExpression *)0x0;
          if (this != (FxSwitchStatement *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          (this_local->super_FxExpression).NeedResult = false;
        }
        else {
          this_local = (FxSwitchStatement *)FxExpression::operator_new((FxExpression *)0x28,size_00)
          ;
          FxNop::FxNop((FxNop *)this_local,&(this->super_FxExpression).ScriptPosition);
        }
      }
      else {
        pFVar1 = ctx->ControlStmt;
        ctx->ControlStmt = &this->super_FxExpression;
        __end1 = TArray<FxExpression_*,_FxExpression_*>::begin
                           (&(this->Content).super_TArray<FxExpression_*,_FxExpression_*>);
        line = (FxExpression **)
               TArray<FxExpression_*,_FxExpression_*>::end
                         (&(this->Content).super_TArray<FxExpression_*,_FxExpression_*>);
        while (bVar3 = TIterator<FxExpression_*>::operator!=
                                 (&__end1,(TIterator<FxExpression_*> *)&line), bVar3) {
          content = (FArgumentList *)TIterator<FxExpression_*>::operator*(&__end1);
          if ((FxExpression *)(content->super_TArray<FxExpression_*,_FxExpression_*>).Array !=
              (FxExpression *)0x0) {
            pFVar2 = (FxExpression *)(content->super_TArray<FxExpression_*,_FxExpression_*>).Array;
            iVar4 = (*pFVar2->_vptr_FxExpression[2])(pFVar2,ctx);
            (content->super_TArray<FxExpression_*,_FxExpression_*>).Array =
                 (FxExpression **)CONCAT44(extraout_var_01,iVar4);
          }
          if ((content->super_TArray<FxExpression_*,_FxExpression_*>).Array == (FxExpression **)0x0)
          {
            if (this != (FxSwitchStatement *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            return (FxExpression *)0x0;
          }
          *(undefined1 *)
           ((long)(content->super_TArray<FxExpression_*,_FxExpression_*>).Array + 0x21) = 0;
          TIterator<FxExpression_*>::operator++(&__end1);
        }
        ctx->ControlStmt = pFVar1;
        uVar5 = (*this->Condition->_vptr_FxExpression[3])();
        if ((uVar5 & 1) == 0) {
          local_a8 = 0x7fffffff;
          __range1_1._4_4_ = -0x80000000;
          __end1_1 = TArray<FxExpression_*,_FxExpression_*>::begin
                               (&(this->Content).super_TArray<FxExpression_*,_FxExpression_*>);
          line_1 = (FxExpression *)
                   TArray<FxExpression_*,_FxExpression_*>::end
                             (&(this->Content).super_TArray<FxExpression_*,_FxExpression_*>);
          while (bVar3 = TIterator<FxExpression_*>::operator!=
                                   (&__end1_1,(TIterator<FxExpression_*> *)&line_1), bVar3) {
            ppFVar8 = TIterator<FxExpression_*>::operator*(&__end1_1);
            pFVar1 = *ppFVar8;
            if ((pFVar1->ExprType == EFX_CaseStatement) &&
               (ca.jumpaddress = (size_t)pFVar1, pFVar1[1]._vptr_FxExpression != (_func_int **)0x0))
            {
              local_e8._0_4_ = *(undefined4 *)&pFVar1[1].ScriptPosition.FileName.Chars;
              ca.casevalue = 0;
              ca._4_4_ = 0;
              TArray<FxSwitchStatement::CaseAddr,_FxSwitchStatement::CaseAddr>::Push
                        (&this->CaseAddresses,(CaseAddr *)local_e8);
              if ((int)local_e8._0_4_ < local_a8) {
                local_a8 = local_e8._0_4_;
              }
              if (__range1_1._4_4_ < (int)local_e8._0_4_) {
                __range1_1._4_4_ = local_e8._0_4_;
              }
            }
            TIterator<FxExpression_*>::operator++(&__end1_1);
          }
        }
        else {
          index = 0;
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,0,"Case expression is constant");
          _defaultbreak = &this->Content;
          caseindex = -1;
          casebreak = -1;
          i = 0xffffffff;
          local_78 = 0xffffffff;
          for (casestmt._4_4_ = 0; uVar5 = casestmt._4_4_,
              uVar6 = TArray<FxExpression_*,_FxExpression_*>::Size
                                ((TArray<FxExpression_*,_FxExpression_*> *)_defaultbreak),
              uVar5 < uVar6; casestmt._4_4_ = casestmt._4_4_ + 1) {
            index = (ulong)casestmt._4_4_;
            ppFVar8 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                ((TArray<FxExpression_*,_FxExpression_*> *)_defaultbreak,index);
            if (*ppFVar8 != (FxExpression *)0x0) {
              ppFVar8 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                  ((TArray<FxExpression_*,_FxExpression_*> *)_defaultbreak,
                                   (ulong)casestmt._4_4_);
              if ((*ppFVar8)->ExprType == EFX_CaseStatement) {
                ppFVar8 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                    ((TArray<FxExpression_*,_FxExpression_*> *)_defaultbreak,
                                     (ulong)casestmt._4_4_);
                local_88 = *ppFVar8;
                if (local_88[1]._vptr_FxExpression == (_func_int **)0x0) {
                  caseindex = casestmt._4_4_;
                }
                else {
                  iVar4 = *(int *)&local_88[1].ScriptPosition.FileName.Chars;
                  FxConstant::GetValue((FxConstant *)&seq);
                  iVar7 = ExpVal::GetInt((ExpVal *)&seq);
                  ExpVal::~ExpVal((ExpVal *)&seq);
                  if (iVar4 == iVar7) {
                    i = casestmt._4_4_;
                  }
                }
                if ((local_88[1]._vptr_FxExpression != (_func_int **)0x0) &&
                   ((PType *)local_88[1]._vptr_FxExpression[3] != this->Condition->ValueType)) {
                  FScriptPosition::Message
                            ((FScriptPosition *)(local_88[1]._vptr_FxExpression + 1),2,
                             "Type mismatch in case statement");
                  if (this != (FxSwitchStatement *)0x0) {
                    (*(this->super_FxExpression)._vptr_FxExpression[1])();
                  }
                  return (FxExpression *)0x0;
                }
              }
              index = (ulong)casestmt._4_4_;
              ppFVar8 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                  ((TArray<FxExpression_*,_FxExpression_*> *)_defaultbreak,index);
              if ((*ppFVar8)->ExprType == EFX_JumpStatement) {
                index = (ulong)casestmt._4_4_;
                ppFVar8 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                    ((TArray<FxExpression_*,_FxExpression_*> *)_defaultbreak,index);
                if (*(int *)&(*ppFVar8)[1]._vptr_FxExpression == 0x126) {
                  if ((-1 < caseindex) && (casebreak < 0)) {
                    casebreak = casestmt._4_4_;
                  }
                  if ((-1 < (int)i) && ((int)local_78 < 0)) {
                    local_78 = casestmt._4_4_;
                    break;
                  }
                }
              }
            }
          }
          if ((int)i < 0) {
            i = caseindex;
            local_78 = casebreak;
          }
          if (((int)i < 1) || ((int)(local_78 - i) < 2)) {
            if (this != (FxSwitchStatement *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            this_local = (FxSwitchStatement *)FxExpression::operator_new((FxExpression *)0x28,index)
            ;
            FxNop::FxNop((FxNop *)this_local,&(this->super_FxExpression).ScriptPosition);
          }
          else {
            this_01 = (FxSequence *)FxExpression::operator_new((FxExpression *)0x38,index);
            FxSequence::FxSequence(this_01,&(this->super_FxExpression).ScriptPosition);
            maxcase = i;
            while (maxcase = maxcase + 1, maxcase < (int)local_78) {
              ppFVar8 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                  ((TArray<FxExpression_*,_FxExpression_*> *)_defaultbreak,
                                   (long)maxcase);
              if ((*ppFVar8 != (FxExpression *)0x0) &&
                 (ppFVar8 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                      ((TArray<FxExpression_*,_FxExpression_*> *)_defaultbreak,
                                       (long)maxcase), (*ppFVar8)->ExprType != EFX_CaseStatement)) {
                ppFVar8 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                    ((TArray<FxExpression_*,_FxExpression_*> *)_defaultbreak,
                                     (long)maxcase);
                FxSequence::Add(this_01,*ppFVar8);
                ppFVar8 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                    ((TArray<FxExpression_*,_FxExpression_*> *)_defaultbreak,
                                     (long)maxcase);
                *ppFVar8 = (FxExpression *)0x0;
              }
            }
            if (this != (FxSwitchStatement *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            iVar4 = (*(this_01->super_FxExpression)._vptr_FxExpression[2])(this_01,ctx);
            this_local = (FxSwitchStatement *)CONCAT44(extraout_var_02,iVar4);
          }
        }
      }
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxSwitchStatement::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Condition, ctx);

	if (Condition->ValueType != TypeName)
	{
		Condition = new FxIntCast(Condition, false);
		SAFE_RESOLVE(Condition, ctx);
	}

	if (Content.Size() == 0)
	{
		ScriptPosition.Message(MSG_WARNING, "Empty switch statement");
		if (Condition->isConstant())
		{
			return new FxNop(ScriptPosition);
		}
		else
		{
			// The condition may have a side effect so it should be processed (possible to-do: Analyze all nodes in there and delete if not.)
			auto x = Condition;
			Condition = nullptr;
			delete this;
			x->NeedResult = false;
			return x;
		}
	}

	auto outerctrl = ctx.ControlStmt;
	ctx.ControlStmt = this;

	for (auto &line : Content)
	{
		SAFE_RESOLVE(line, ctx);
		line->NeedResult = false;
	}
	ctx.ControlStmt = outerctrl;

	if (Condition->isConstant())
	{
		ScriptPosition.Message(MSG_WARNING, "Case expression is constant");
		auto &content = Content;
		int defaultindex = -1;
		int defaultbreak = -1;
		int caseindex = -1;
		int casebreak = -1;
		// look for a case label with a matching value
		for (unsigned i = 0; i < content.Size(); i++)
		{
			if (content[i] != nullptr)
			{
				if (content[i]->ExprType == EFX_CaseStatement)
				{
					auto casestmt = static_cast<FxCaseStatement *>(content[i]);
					if (casestmt->Condition == nullptr) defaultindex = i;
					else if (casestmt->CaseValue == static_cast<FxConstant *>(Condition)->GetValue().GetInt()) caseindex = i;
					if (casestmt->Condition && casestmt->Condition->ValueType != Condition->ValueType)
					{
						casestmt->Condition->ScriptPosition.Message(MSG_ERROR, "Type mismatch in case statement");
						delete this;
						return nullptr;
					}
				}
				if (content[i]->ExprType == EFX_JumpStatement && static_cast<FxJumpStatement *>(content[i])->Token == TK_Break)
				{
					if (defaultindex >= 0 && defaultbreak < 0) defaultbreak = i;
					if (caseindex >= 0 && casebreak < 0)
					{
						casebreak = i;
						break;	// when we find this we do not need to look any further.
					}
				}
			}
		}
		if (caseindex < 0)
		{
			caseindex = defaultindex;
			casebreak = defaultbreak;
		}
		if (caseindex > 0 && casebreak - caseindex > 1)
		{
			auto seq = new FxSequence(ScriptPosition);
			for (int i = caseindex + 1; i < casebreak; i++)
			{
				if (content[i] != nullptr && content[i]->ExprType != EFX_CaseStatement)
				{
					seq->Add(content[i]);
					content[i] = nullptr;
				}
			}
			delete this;
			return seq->Resolve(ctx);
		}
		delete this;
		return new FxNop(ScriptPosition);
	}

	int mincase = INT_MAX;
	int maxcase = INT_MIN;
	for (auto line : Content)
	{
		if (line->ExprType == EFX_CaseStatement)
		{
			auto casestmt = static_cast<FxCaseStatement *>(line);
			if (casestmt->Condition != nullptr)
			{
				CaseAddr ca = { casestmt->CaseValue, 0 };
				CaseAddresses.Push(ca);
				if (ca.casevalue < mincase) mincase = ca.casevalue;
				if (ca.casevalue > maxcase) maxcase = ca.casevalue;
			}
		}
	}
	return this;
}